

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O3

errr finish_parse_summon(parser *p)

{
  wchar_t wVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  summon *psVar10;
  wchar_t wVar11;
  undefined8 *puVar12;
  long *p_00;
  long lVar13;
  bool bVar14;
  
  summon_max = L'\0';
  for (puVar12 = (undefined8 *)parser_priv(p); puVar12 != (undefined8 *)0x0;
      puVar12 = (undefined8 *)*puVar12) {
    summon_max = summon_max + L'\x01';
  }
  summons = (summon *)mem_zalloc((long)summon_max * 0x40 + 0x40);
  lVar13 = (long)summon_max;
  p_00 = (long *)parser_priv(p);
  if (p_00 != (long *)0x0) {
    lVar13 = lVar13 << 6;
    do {
      psVar10 = summons;
      lVar3 = *p_00;
      lVar4 = p_00[1];
      lVar5 = p_00[2];
      lVar6 = p_00[3];
      lVar7 = p_00[4];
      lVar8 = p_00[5];
      lVar9 = p_00[7];
      plVar2 = (long *)((long)&summons[-1].fallback + lVar13);
      *plVar2 = p_00[6];
      plVar2[1] = lVar9;
      plVar2 = (long *)((long)&psVar10[-1].race_flag + lVar13);
      *plVar2 = lVar7;
      plVar2[1] = lVar8;
      plVar2 = (long *)((long)&psVar10[-1].message_type + lVar13);
      *plVar2 = lVar5;
      plVar2[1] = lVar6;
      plVar2 = (long *)((long)&psVar10[-1].next + lVar13);
      *plVar2 = lVar3;
      plVar2[1] = lVar4;
      plVar2 = (long *)*p_00;
      *(undefined8 *)((long)&psVar10[-1].next + lVar13) = 0;
      mem_free(p_00);
      p_00 = plVar2;
      lVar13 = lVar13 + -0x40;
    } while (plVar2 != (long *)0x0);
  }
  psVar10 = summons;
  wVar1 = summon_max + L'\x01';
  bVar14 = L'\xffffffff' < summon_max;
  summon_max = wVar1;
  if (bVar14) {
    lVar13 = 0;
    do {
      wVar11 = summon_name_to_idx(*(char **)((long)&psVar10->fallback_name + lVar13));
      *(wchar_t *)((long)&psVar10->fallback + lVar13) = wVar11;
      lVar13 = lVar13 + 0x40;
    } while ((ulong)(uint)wVar1 << 6 != lVar13);
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_summon(struct parser *p) {
	struct summon *summon, *next;
	int index;

	/* Count the entries */
	summon_max = 0;
	summon = parser_priv(p);
	while (summon) {
		summon_max++;
		summon = summon->next;
	}

	/* Allocate the direct access list and copy the data to it */
	summons = mem_zalloc((summon_max + 1) * sizeof(*summon));
	index = summon_max - 1;
	for (summon = parser_priv(p); summon; summon = next, index--) {
		memcpy(&summons[index], summon, sizeof(*summon));
		next = summon->next;
		summons[index].next = NULL;

		mem_free(summon);
	}
	summon_max += 1;

	/* Add indices of fallback summons */
	for (index = 0; index < summon_max; index++) {
		char *name = summons[index].fallback_name;
		summons[index].fallback = summon_name_to_idx(name);
	}

	parser_destroy(p);
	return 0;
}